

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_dialer_set_tls(nng_dialer id,nng_tls_config *cfg)

{
  int iVar1;
  nni_dialer *local_20;
  nni_dialer *d;
  
  iVar1 = nni_dialer_find(&local_20,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_dialer_set_tls(local_20,cfg);
    nni_dialer_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_dialer_set_tls(nng_dialer id, nng_tls_config *cfg)
{
	int         rv;
	nni_dialer *d;
	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_set_tls(d, cfg);
	nni_dialer_rele(d);
	return (rv);
}